

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  __m512 afVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  long *in_RDX;
  long *in_RSI;
  float *x;
  long *in_RDI;
  bool bVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  __m128 afVar14;
  __m128 _outp_2;
  __m128 _p1_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _p1_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _p1;
  __m512 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_max op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  __m256 *in_stack_fffffffffffff980;
  binary_op_max *in_stack_fffffffffffff988;
  binary_op_max *in_stack_fffffffffffff990;
  Allocator *in_stack_fffffffffffff998;
  Mat *in_stack_fffffffffffff9a0;
  Mat *in_stack_fffffffffffff9a8;
  binary_op_max *this;
  float local_5c0 [2];
  float afStack_5b8 [2];
  float local_5b0 [2];
  float afStack_5a8 [2];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  int local_464;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined4 local_448;
  long local_440;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined8 local_420;
  float *local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined4 local_3f8;
  long local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined8 local_3d0;
  float *local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  float *local_378;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  int local_358;
  binary_op_max local_351 [9];
  long *local_348;
  long *local_340;
  long *local_338;
  int local_32c;
  long *local_328;
  undefined1 local_31d;
  int local_31c;
  undefined8 *local_310;
  undefined1 local_305;
  int local_304;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  binary_op_max *local_2c0;
  undefined1 local_2b5;
  int local_2b4;
  undefined8 *local_2a8;
  undefined8 *local_298;
  float *local_290;
  float *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float *local_238;
  float *local_230;
  float *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  float *local_1f8;
  float *local_1f0;
  float *local_1e8;
  undefined8 local_1e0;
  float afStack_1d8 [4];
  float *local_1c8;
  long *local_1c0;
  long local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  float *local_1a0;
  undefined4 local_194;
  int local_190;
  int local_18c;
  undefined8 *local_188;
  long local_180;
  undefined4 local_174;
  long local_170;
  float *local_168;
  undefined4 local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  long local_148;
  undefined4 local_13c;
  long local_138;
  float *local_130;
  undefined4 local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  binary_op_max *local_c8;
  undefined8 *local_b8;
  undefined8 *local_a8;
  
  local_358 = *(int *)((long)in_RDI + 0x2c);
  local_35c = (int)in_RDI[6];
  local_360 = *(int *)((long)in_RDI + 0x34);
  local_364 = (int)in_RDI[7];
  local_368 = (int)in_RDI[3];
  local_36c = local_358 * local_35c * local_360 * local_368;
  local_348 = in_RDX;
  local_340 = in_RSI;
  local_338 = in_RDI;
  Mat::create_like(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  local_328 = local_348;
  bVar4 = true;
  if (*local_348 != 0) {
    local_1c0 = local_348;
    bVar4 = local_348[8] * (long)(int)local_348[7] == 0;
  }
  if (bVar4) {
    local_32c = -100;
  }
  else {
    for (local_370 = 0; local_370 < local_364; local_370 = local_370 + 1) {
      local_2f8 = &local_3c0;
      local_154 = *(int *)((long)local_338 + 0x2c);
      local_158 = (int)local_338[6];
      local_15c = *(undefined4 *)((long)local_338 + 0x34);
      local_378 = (float *)(*local_338 + local_338[8] * (long)local_370 * local_338[2]);
      local_170 = local_338[2];
      local_174 = (undefined4)local_338[3];
      local_180 = local_338[4];
      local_150 = &local_3c0;
      local_f8 = (long)local_154 * (long)local_158 * local_170;
      local_2e8 = &local_3c0;
      local_2d0 = &local_3c0;
      local_310 = &local_410;
      local_11c = *(int *)((long)local_340 + 0x2c);
      local_120 = (int)local_340[6];
      local_124 = *(undefined4 *)((long)local_340 + 0x34);
      local_3c8 = (float *)(*local_340 + local_340[8] * (long)local_370 * local_340[2]);
      local_138 = local_340[2];
      local_13c = (undefined4)local_340[3];
      local_148 = local_340[4];
      local_118 = &local_410;
      local_108 = (long)local_11c * (long)local_120 * local_138;
      local_2f0 = &local_410;
      local_2c8 = &local_410;
      local_2a8 = &local_460;
      local_18c = *(int *)((long)local_348 + 0x2c);
      local_190 = (int)local_348[6];
      local_194 = *(undefined4 *)((long)local_348 + 0x34);
      x = (float *)(*local_348 + local_348[8] * (long)local_370 * local_348[2]);
      local_1a8 = local_348[2];
      local_1ac = (undefined4)local_348[3];
      local_1b8 = local_348[4];
      local_188 = &local_460;
      local_e8 = (long)local_18c * (long)local_190 * local_1a8;
      local_298 = &local_460;
      this = (binary_op_max *)&local_460;
      local_388 = 0;
      local_38c = 0;
      local_390 = 0;
      local_394 = 0;
      local_3a8 = 0;
      local_3b0 = 0;
      local_3b8 = 0;
      local_3c0 = 0;
      local_3d8 = 0;
      local_3dc = 0;
      local_3e0 = 0;
      local_3e4 = 0;
      local_3f8 = 0;
      local_400 = 0;
      local_408 = 0;
      local_410 = 0;
      local_ec = 0x10;
      local_fc = 0x10;
      local_10c = 0x10;
      local_2b4 = local_370;
      local_2b5 = 1;
      local_304 = local_370;
      local_305 = 1;
      local_31c = local_370;
      local_31d = 1;
      local_380 = 0;
      local_398 = 0;
      local_3d0 = 0;
      local_3e8 = 0;
      local_460 = 0;
      local_450 = 0;
      local_448 = 0;
      local_438 = 0;
      local_434 = 0;
      local_430 = 0;
      local_42c = 0;
      local_428 = 0;
      local_420 = 0;
      local_458 = 0;
      local_418 = x;
      local_2c0 = this;
      local_1a0 = x;
      local_168 = local_378;
      local_130 = local_3c8;
      local_c8 = this;
      local_b8 = local_2c8;
      local_a8 = local_2d0;
      local_440 = local_1b8;
      local_3f0 = local_148;
      local_3a0 = local_180;
      for (local_464 = 0; local_464 + 0xf < local_36c; local_464 = local_464 + 0x10) {
        local_288 = local_378;
        local_4c0 = *(undefined8 *)local_378;
        uStack_4b8 = *(undefined8 *)(local_378 + 2);
        uStack_4b0 = *(undefined8 *)(local_378 + 4);
        uStack_4a8 = *(undefined8 *)(local_378 + 6);
        uStack_4a0 = *(undefined8 *)(local_378 + 8);
        uStack_498 = *(undefined8 *)(local_378 + 10);
        uStack_490 = *(undefined8 *)(local_378 + 0xc);
        uStack_488 = *(undefined8 *)(local_378 + 0xe);
        local_290 = local_3c8;
        uVar7 = *(undefined8 *)local_3c8;
        uVar6 = *(undefined8 *)(local_3c8 + 2);
        uVar8 = *(undefined8 *)(local_3c8 + 4);
        uVar9 = *(undefined8 *)(local_3c8 + 6);
        uVar10 = *(undefined8 *)(local_3c8 + 8);
        uVar11 = *(undefined8 *)(local_3c8 + 10);
        uVar12 = *(undefined8 *)(local_3c8 + 0xc);
        uVar13 = *(undefined8 *)(local_3c8 + 0xe);
        local_500 = uVar7;
        uStack_4f8 = uVar6;
        uStack_4f0 = uVar8;
        uStack_4e8 = uVar9;
        uStack_4e0 = uVar10;
        uStack_4d8 = uVar11;
        uStack_4d0 = uVar12;
        uStack_4c8 = uVar13;
        BinaryOp_x86_avx512_functor::binary_op_max::func_pack16
                  (this,(__m512 *)x,(__m512 *)in_stack_fffffffffffff9a0);
        local_238 = local_418;
        afVar1[2] = (float)(int)uVar6;
        afVar1[3] = (float)(int)((ulong)uVar6 >> 0x20);
        afVar1[0] = (float)(int)uVar7;
        afVar1[1] = (float)(int)((ulong)uVar7 >> 0x20);
        afVar1[4] = (float)(int)uVar8;
        afVar1[5] = (float)(int)((ulong)uVar8 >> 0x20);
        afVar1[6] = (float)(int)uVar9;
        afVar1[7] = (float)(int)((ulong)uVar9 >> 0x20);
        afVar1[8] = (float)(int)uVar10;
        afVar1[9] = (float)(int)((ulong)uVar10 >> 0x20);
        afVar1[10] = (float)(int)uVar11;
        afVar1[0xb] = (float)(int)((ulong)uVar11 >> 0x20);
        afVar1[0xc] = (float)(int)uVar12;
        afVar1[0xd] = (float)(int)((ulong)uVar12 >> 0x20);
        afVar1[0xe] = (float)(int)uVar13;
        afVar1[0xf] = (float)(int)((ulong)uVar13 >> 0x20);
        *(__m512 *)local_418 = afVar1;
        local_378 = local_378 + 0x10;
        local_3c8 = local_3c8 + 0x10;
        local_418 = local_418 + 0x10;
        local_540 = uVar7;
        uStack_538 = uVar6;
        uStack_530 = uVar8;
        uStack_528 = uVar9;
        uStack_520 = uVar10;
        uStack_518 = uVar11;
        uStack_510 = uVar12;
        uStack_508 = uVar13;
        local_280 = uVar7;
        uStack_278 = uVar6;
        uStack_270 = uVar8;
        uStack_268 = uVar9;
        uStack_260 = uVar10;
        uStack_258 = uVar11;
        uStack_250 = uVar12;
        uStack_248 = uVar13;
      }
      for (; local_464 + 7 < local_36c; local_464 = local_464 + 8) {
        local_228 = local_378;
        local_560 = *(undefined8 *)local_378;
        uStack_558 = *(undefined8 *)(local_378 + 2);
        uStack_550 = *(undefined8 *)(local_378 + 4);
        uStack_548 = *(undefined8 *)(local_378 + 6);
        local_230 = local_3c8;
        uVar7 = *(undefined8 *)local_3c8;
        uVar6 = *(undefined8 *)(local_3c8 + 2);
        uVar8 = *(undefined8 *)(local_3c8 + 4);
        uVar9 = *(undefined8 *)(local_3c8 + 6);
        local_580 = uVar7;
        uStack_578 = uVar6;
        uStack_570 = uVar8;
        uStack_568 = uVar9;
        BinaryOp_x86_avx512_functor::binary_op_max::func_pack8
                  (in_stack_fffffffffffff990,(__m256 *)in_stack_fffffffffffff988,
                   in_stack_fffffffffffff980);
        local_1f8 = local_418;
        auVar2._8_8_ = uVar6;
        auVar2._0_8_ = uVar7;
        auVar2._16_8_ = uVar8;
        auVar2._24_8_ = uVar9;
        *(undefined1 (*) [32])local_418 = auVar2;
        local_378 = local_378 + 8;
        local_3c8 = local_3c8 + 8;
        local_418 = local_418 + 8;
        local_5a0 = uVar7;
        uStack_598 = uVar6;
        uStack_590 = uVar8;
        uStack_588 = uVar9;
        local_220 = uVar7;
        uStack_218 = uVar6;
        uStack_210 = uVar8;
        uStack_208 = uVar9;
      }
      for (; local_464 + 3 < local_36c; local_464 = local_464 + 4) {
        local_1e8 = local_378;
        local_5b0 = *(float (*) [2])local_378;
        afStack_5a8 = *(float (*) [2])(local_378 + 2);
        local_1f0 = local_3c8;
        local_5c0 = *(float (*) [2])local_3c8;
        uVar7 = *(undefined8 *)(local_3c8 + 2);
        afStack_5b8 = (float  [2])uVar7;
        afVar14 = BinaryOp_x86_avx512_functor::binary_op_max::func_pack4
                            (local_351,(__m128 *)local_5b0,(__m128 *)local_5c0);
        local_1e0 = afVar14._0_8_;
        local_1c8 = local_418;
        auVar3._8_4_ = (float)uVar7;
        auVar3._12_4_ = SUB84(uVar7,4);
        auVar3._0_8_ = local_1e0;
        *(undefined1 (*) [16])local_418 = auVar3;
        local_378 = local_378 + 4;
        local_3c8 = local_3c8 + 4;
        local_418 = local_418 + 4;
        afStack_1d8._0_8_ = uVar7;
      }
      for (; local_464 < local_36c; local_464 = local_464 + 1) {
        fVar5 = BinaryOp_x86_avx512_functor::binary_op_max::func
                          (in_stack_fffffffffffff988,*in_stack_fffffffffffff980,(float *)0x1511bca);
        *local_418 = fVar5;
        local_378 = local_378 + 1;
        local_3c8 = local_3c8 + 1;
        local_418 = local_418 + 1;
      }
    }
    local_32c = 0;
  }
  return local_32c;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}